

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_SetPixel(SetPixelForm2 SetPixel)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_t j;
  ulong uVar4;
  ulong uVar5;
  allocator_type local_a1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image image;
  
  Unit_Test::intensityArray(&intensity,2);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&X,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&image,value,0,0,(Image *)&X);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate((ImageTemplate<unsigned_char> *)&X);
  uVar2 = rand();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&X,(ulong)(uVar2 % 100 + (uint)(uVar2 % 100 == 0)),(allocator_type *)&Y);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&Y,(long)X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2,&local_a1);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
    uVar2 = Test_Helper::randomValue<unsigned_int>(0,image._width);
    X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = uVar2;
    uVar2 = Test_Helper::randomValue<unsigned_int>(0,image._height);
    Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = uVar2;
  }
  (*SetPixel)(&image,&X,&Y,
              intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[1]);
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    uVar5 = (long)X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (uVar5 <= uVar3) break;
    bVar1 = Unit_Test::verifyImage
                      (&image,X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar3],
                       Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar3],1,1,
                       intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[1]);
    uVar4 = uVar3 + 1;
  } while (bVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&Y.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&X.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar5 <= uVar3;
}

Assistant:

bool form2_SetPixel(SetPixelForm2 SetPixel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image image  = uniformImage( intensity[0] );
        std::vector< uint32_t > X( randomValue<uint32_t>( 1, 100 ) );
        std::vector< uint32_t > Y( X.size() );

        for (size_t j = 0; j < X.size(); j++) {
            X[j] = randomValue<uint32_t>( 0, image.width() );
            Y[j] = randomValue<uint32_t>( 0, image.height() );
        }

        SetPixel( image, X, Y, intensity[1] );

        for (size_t j = 0; j < X.size(); j++) {
            if( !verifyImage( image, X[j], Y[j], 1, 1, intensity[1] ) )
                return false;
        }

        return true;
    }